

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict abstract_declarator(c2m_ctx_t c2m_ctx,int no_err_p)

{
  node_t pnVar1;
  node_t_conflict pnVar2;
  node_t_conflict pnVar3;
  node_t_conflict op2;
  node_t elem;
  node *pnVar4;
  pos_t p;
  
  if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x2a) {
    pnVar2 = direct_abstract_declarator(c2m_ctx,no_err_p);
    return pnVar2;
  }
  pnVar2 = pointer(c2m_ctx,no_err_p);
  pnVar4 = &err_struct;
  if (pnVar2 != &err_struct) {
    pnVar4 = try_f(c2m_ctx,direct_abstract_declarator);
    if (pnVar4 == &err_struct) {
      p = get_node_pos(c2m_ctx,pnVar2);
      pnVar3 = new_node(c2m_ctx,N_IGNORE);
      op2 = new_node(c2m_ctx,N_LIST);
      pnVar4 = new_pos_node2(c2m_ctx,N_DECL,p,pnVar3,op2);
    }
    if (pnVar2 != (node_t_conflict)0x0) {
      pnVar3 = (((pnVar4->u).ops.head)->op_link).next;
      if (pnVar3->code != N_LIST) {
        __assert_fail("list->code == N_LIST",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1366,"node_t abstract_declarator(c2m_ctx_t, int)");
      }
      elem = (pnVar2->u).ops.head;
      while (elem != (node_t_conflict)0x0) {
        pnVar1 = (elem->op_link).next;
        DLIST_node_t_remove(&(pnVar2->u).ops,elem);
        op_append(c2m_ctx,pnVar3,elem);
        elem = pnVar1;
      }
    }
  }
  return pnVar4;
}

Assistant:

D (abstract_declarator) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, p = NULL, r, el, next_el;

  if (C ('*')) {
    P (pointer);
    p = r;
    if ((r = TRY (direct_abstract_declarator)) == err_node)
      r = new_pos_node2 (c2m_ctx, N_DECL, POS (p), new_node (c2m_ctx, N_IGNORE),
                         new_node (c2m_ctx, N_LIST));
  } else {
    P (direct_abstract_declarator);
  }
  if (p != NULL) {
    list = NL_NEXT (NL_HEAD (r->u.ops));
    assert (list->code == N_LIST);
    for (el = NL_HEAD (p->u.ops); el != NULL; el = next_el) {
      next_el = NL_NEXT (el);
      NL_REMOVE (p->u.ops, el);
      op_append (c2m_ctx, list, el);
    }
  }
  return r;
}